

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O0

void eve::randomiseevents
               (OASIS_INT pno_,OASIS_INT total_,vector<int,_std::allocator<int>_> *events,
               bool textmode)

{
  FILE *__stream;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  bool bVar1;
  result_type rVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b;
  uint *puVar3;
  reference __ptr;
  uniform_int_distribution<int> local_50;
  uniform_int_distribution<int> d;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  iterator it;
  size_type sStack_30;
  int counter;
  size_type eventsSize;
  default_random_engine e;
  uint seed;
  bool textmode_local;
  vector<int,_std::allocator<int>_> *events_local;
  OASIS_INT total__local;
  OASIS_INT pno__local;
  
  e._M_x._0_4_ = 0x4d2;
  e._M_x._7_1_ = textmode;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&eventsSize,
             0x4d2);
  sStack_30 = std::vector<int,_std::allocator<int>_>::size(events);
  it._M_current._4_4_ = 1;
  local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(events);
  while( true ) {
    d._M_param = (param_type)std::vector<int,_std::allocator<int>_>::end(events);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&d);
    if (!bVar1) break;
    sStack_30 = sStack_30 - 1;
    std::uniform_int_distribution<int>::uniform_int_distribution(&local_50,0,(int)sStack_30);
    __a._M_current = local_40._M_current;
    rVar2 = std::uniform_int_distribution<int>::operator()
                      (&local_50,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &eventsSize);
    __b = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (&local_40,(long)rVar2);
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (__a,__b);
    __stream = _stdout;
    if ((it._M_current._4_4_ - pno_) % total_ == 0) {
      if ((e._M_x._7_1_ & 1) == 0) {
        __ptr = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_40);
        fwrite(__ptr,4,1,_stdout);
      }
      else {
        puVar3 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&local_40);
        fprintf(__stream,"%d\n",(ulong)*puVar3);
      }
    }
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40,0);
  }
  return;
}

Assistant:

void randomiseevents(OASIS_INT pno_, OASIS_INT total_,
			 std::vector<int> &events, bool textmode) {

	unsigned seed = 1234;
	std::default_random_engine e(seed);

	// As we only consider swapping each element once as we go through the
	// vector sequentially, we can output events IDs as we proceed. We are
	// only interested in a particular process ID, so only output events IDs
	// assigned to that process
	auto eventsSize = events.size();
	int counter = 1;
	for (std::vector<int>::iterator it = events.begin(); it != events.end();
	     it++) {

	    // Implement Fisher-Yates shuffle
	    std::uniform_int_distribution<> d(0, --eventsSize);
	    std::iter_swap(it, it + d(e));

	    if ((counter - pno_) % total_ == 0) {

		if (textmode) fprintf(stdout, "%d\n", *it);
		else fwrite(&(*it), sizeof(*it), 1, stdout);

	    }
	    counter++;

	}

    }